

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

void al_set_blend_color(ALLEGRO_COLOR color)

{
  long lVar1;
  long *plVar2;
  float local_28;
  float fStack_24;
  
  plVar2 = (long *)__tls_get_addr(&PTR_001d9500);
  if (*plVar2 == 0) {
    *plVar2 = (long)(plVar2 + 1);
    initialize_tls_values((thread_local_state *)(plVar2 + 1));
  }
  lVar1 = *plVar2;
  if (lVar1 != 0) {
    local_28 = color.r;
    fStack_24 = color.g;
    *(float *)(lVar1 + 0xf8) = local_28;
    *(float *)(lVar1 + 0xfc) = fStack_24;
    *(float *)(lVar1 + 0x100) = color.b;
    *(float *)(lVar1 + 0x104) = color.a;
  }
  return;
}

Assistant:

void al_set_blend_color(ALLEGRO_COLOR color)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return;

   tls->current_blender.blend_color = color;
}